

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMRangeImpl::traverseRightBoundary(DOMRangeImpl *this,DOMNode *root,int how)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  DOMNode *pDVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  DOMNode *clonedGrandParent;
  DOMNode *clonedChild;
  DOMNode *prevSibling;
  DOMNode *clonedParent;
  DOMNode *parent;
  DOMNode *pDStack_30;
  bool isFullySelected;
  DOMNode *next;
  int how_local;
  DOMNode *root_local;
  DOMRangeImpl *this_local;
  
  pDStack_30 = getSelectedNode(this,this->fEndContainer,(int)this->fEndOffset + -1);
  parent._7_1_ = pDStack_30 != this->fEndContainer;
  if (pDStack_30 == root) {
    this_local = (DOMRangeImpl *)traverseNode(this,pDStack_30,parent._7_1_,false,how);
  }
  else {
    iVar1 = (*pDStack_30->_vptr_DOMNode[5])();
    clonedParent = (DOMNode *)CONCAT44(extraout_var,iVar1);
    pDVar3 = traverseNode(this,clonedParent,false,false,how);
    while (prevSibling = pDVar3, clonedParent != (DOMNode *)0x0) {
      while (pDStack_30 != (DOMNode *)0x0) {
        iVar1 = (*pDStack_30->_vptr_DOMNode[9])();
        pDVar3 = traverseNode(this,pDStack_30,parent._7_1_,false,how);
        if (how != 3) {
          iVar2 = (*prevSibling->_vptr_DOMNode[7])();
          (*prevSibling->_vptr_DOMNode[0xe])(prevSibling,pDVar3,CONCAT44(extraout_var_01,iVar2));
        }
        parent._7_1_ = true;
        pDStack_30 = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
      }
      if (clonedParent == root) {
        return prevSibling;
      }
      iVar1 = (*clonedParent->_vptr_DOMNode[9])();
      pDStack_30 = (DOMNode *)CONCAT44(extraout_var_02,iVar1);
      iVar1 = (*clonedParent->_vptr_DOMNode[5])();
      clonedParent = (DOMNode *)CONCAT44(extraout_var_03,iVar1);
      pDVar3 = traverseNode(this,clonedParent,false,false,how);
      if (how != 3) {
        (*pDVar3->_vptr_DOMNode[0x11])(pDVar3,prevSibling);
      }
    }
    this_local = (DOMRangeImpl *)0x0;
  }
  return (DOMNode *)this_local;
}

Assistant:

DOMNode* DOMRangeImpl::traverseRightBoundary( DOMNode*root, int how )
{
    DOMNode*next = getSelectedNode( fEndContainer, (int)fEndOffset-1 );
    bool isFullySelected = ( next!=fEndContainer );

    if ( next==root )
        return traverseNode( next, isFullySelected, false, how );

    DOMNode*parent = next->getParentNode();
    DOMNode*clonedParent = traverseNode( parent, false, false, how );

    while( parent!=0 )
    {
        while( next!=0 )
        {
            DOMNode* prevSibling = next->getPreviousSibling();
            DOMNode* clonedChild =
                traverseNode( next, isFullySelected, false, how );
            if ( how!=DELETE_CONTENTS )
            {
                clonedParent->insertBefore(
                    clonedChild,
                    clonedParent->getFirstChild()
                );
            }
            isFullySelected = true;
            next = prevSibling;
        }
        if ( parent==root )
            return clonedParent;

        next = parent->getPreviousSibling();
        parent = parent->getParentNode();
        DOMNode* clonedGrandParent = traverseNode( parent, false, false, how );
        if ( how!=DELETE_CONTENTS )
            clonedGrandParent->appendChild( clonedParent );
        clonedParent = clonedGrandParent;

    }

    // should never occur
    return 0;
}